

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall
Lowerer::GetValueFromIndirOpnd
          (Lowerer *this,IndirOpnd *indirOpnd,Opnd **pValueOpnd,IntConstType *pValue)

{
  bool bVar1;
  uint uVar2;
  RegOpnd *pRVar3;
  IntConstOpnd *pIVar4;
  ulong value;
  
  pRVar3 = indirOpnd->m_indexOpnd;
  if (pRVar3 == (RegOpnd *)0x0) {
    uVar2 = indirOpnd->m_offset;
  }
  else {
    bVar1 = StackSym::IsIntConst(pRVar3->m_sym);
    pIVar4 = (IntConstOpnd *)0x0;
    value = 0;
    if (!bVar1) goto LAB_005780b0;
    pRVar3 = IR::Opnd::AsRegOpnd(&pRVar3->super_Opnd);
    uVar2 = StackSym::GetIntConstValue(pRVar3->m_sym);
  }
  if ((int)uVar2 < 0) {
    return false;
  }
  value = (ulong)uVar2;
  pIVar4 = IR::IntConstOpnd::New(value,TyInt32,this->m_func,false);
LAB_005780b0:
  *pValueOpnd = &pIVar4->super_Opnd;
  *pValue = value;
  return true;
}

Assistant:

bool
Lowerer::GetValueFromIndirOpnd(IR::IndirOpnd *indirOpnd, IR::Opnd **pValueOpnd, IntConstType *pValue)
{
    IR::RegOpnd *indexOpnd = indirOpnd->GetIndexOpnd();
    IR::Opnd* valueOpnd = nullptr;
    IntConstType value = 0;
    if (!indexOpnd)
    {
        value = (IntConstType)indirOpnd->GetOffset();
        if (value < 0)
        {
            // Can't do fast path for negative index
            return false;
        }
        valueOpnd = IR::IntConstOpnd::New(value, TyInt32, this->m_func);
    }
    else if (indexOpnd->m_sym->IsIntConst())
    {
        value = indexOpnd->AsRegOpnd()->m_sym->GetIntConstValue();
        if (value < 0)
        {
            // Can't do fast path for negative index
            return false;
        }
        valueOpnd = IR::IntConstOpnd::New(value, TyInt32, this->m_func);
    }
    *pValueOpnd = valueOpnd;
    *pValue = value;
    return true;
}